

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

uint cmSystemTools::RandomSeed(void)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  long lVar5;
  uint tv_usec;
  uint tv_sec;
  uint pid;
  timeval t;
  char local_218 [8];
  ifstream fin;
  uint local_10;
  uint local_c;
  anon_union_4_2_474df5d4 seed;
  
  std::ifstream::ifstream(local_218);
  pcVar3 = (char *)std::ifstream::rdbuf();
  std::streambuf::pubsetbuf(pcVar3,0);
  std::ifstream::open(local_218,0x1247f44);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    plVar4 = (long *)std::istream::read(local_218,(long)&local_10);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar2) && (lVar5 = std::istream::gcount(), lVar5 == 4)) {
      local_c = local_10;
      goto LAB_0068ec36;
    }
  }
  gettimeofday((timeval *)&tv_sec,(__timezone_ptr_t)0x0);
  local_c = getpid();
  local_c = tv_sec ^ (int)t.tv_sec << 0x15 ^ local_c;
LAB_0068ec36:
  t.tv_usec._0_4_ = 1;
  std::ifstream::~ifstream(local_218);
  return local_c;
}

Assistant:

unsigned int cmSystemTools::RandomSeed()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  unsigned int seed = 0;

  // Try using a real random source.
  if (WinCryptRandom(&seed, sizeof(seed))) {
    return seed;
  }

  // Fall back to the time and pid.
  FILETIME ft;
  GetSystemTimeAsFileTime(&ft);
  unsigned int t1 = static_cast<unsigned int>(ft.dwHighDateTime);
  unsigned int t2 = static_cast<unsigned int>(ft.dwLowDateTime);
  unsigned int pid = static_cast<unsigned int>(GetCurrentProcessId());
  return t1 ^ t2 ^ pid;
#else
  union
  {
    unsigned int integer;
    char bytes[sizeof(unsigned int)];
  } seed;

  // Try using a real random source.
  cmsys::ifstream fin;
  fin.rdbuf()->pubsetbuf(nullptr, 0); // Unbuffered read.
  fin.open("/dev/urandom");
  if (fin.good() && fin.read(seed.bytes, sizeof(seed)) &&
      fin.gcount() == sizeof(seed)) {
    return seed.integer;
  }

  // Fall back to the time and pid.
  struct timeval t;
  gettimeofday(&t, nullptr);
  unsigned int pid = static_cast<unsigned int>(getpid());
  unsigned int tv_sec = static_cast<unsigned int>(t.tv_sec);
  unsigned int tv_usec = static_cast<unsigned int>(t.tv_usec);
  // Since tv_usec never fills more than 11 bits we shift it to fill
  // in the slow-changing high-order bits of tv_sec.
  return tv_sec ^ (tv_usec << 21) ^ pid;
#endif
}